

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O1

void __thiscall
libsgp4::DateTime::Initialise
          (DateTime *this,int year,int month,int day,int hour,int minute,int second,int microsecond)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int previousYear;
  
  uVar1 = year - 1;
  bVar2 = true;
  if ((month - 1U < 0xc && uVar1 < 9999) && (0 < day)) {
    iVar4 = DaysInMonth(year,month);
    if (day <= iVar4) {
      bVar2 = false;
    }
  }
  if (((((uint)microsecond < 1000000) && ((uint)second < 0x3c)) && ((uint)minute < 0x3c)) &&
     (((uint)hour < 0x18 && (!bVar2)))) {
    iVar4 = DayOfYear(this,year,month,day);
    uVar5 = year + 2;
    if (-1 < (int)uVar1) {
      uVar5 = uVar1;
    }
    iVar3 = (int)((ulong)((long)(int)uVar1 * -0x51eb851f) >> 0x20);
    this->m_encoded =
         (ulong)(uint)microsecond + (ulong)(uint)(minute * 0x3c + hour * 0xe10 + second) * 1000000 +
         (long)(int)(iVar4 + (int)uVar1 / 400 +
                             ((iVar3 >> 5) - (iVar3 >> 0x1f)) + ((int)uVar5 >> 2) + uVar1 * 0x16d +
                    -1) * 86400000000;
    return;
  }
  __assert_fail("false && \"Invalid date\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dnwrnr[P]sgp4/libsgp4/DateTime.h"
                ,0x90,"void libsgp4::DateTime::Initialise(int, int, int, int, int, int, int)");
}

Assistant:

void Initialise(int year,
            int month,
            int day,
            int hour,
            int minute,
            int second,
            int microsecond)
    {
        if (!IsValidYearMonthDay(year, month, day) ||
                hour < 0 || hour > 23 ||
                minute < 0 || minute > 59 ||
                second < 0 || second > 59 ||
                microsecond < 0 || microsecond > 999999)
        {
            assert(false && "Invalid date");
        }
        m_encoded = TimeSpan(
                AbsoluteDays(year, month, day),
                hour,
                minute,
                second,
                microsecond).Ticks();
    }